

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfWav.cpp
# Opt level: O0

void Imf_2_5::wav2Decode(unsigned_short *in,int nx,int ox,int ny,int oy,unsigned_short mx)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  unsigned_short *a;
  unsigned_short *b;
  uint in_ECX;
  int in_EDX;
  uint in_ESI;
  unsigned_short *in_RDI;
  int in_R8D;
  ushort in_R9W;
  unsigned_short *p01_1;
  unsigned_short *ex_1;
  unsigned_short *px_1;
  unsigned_short *p10_1;
  unsigned_short *p11;
  unsigned_short *p10;
  unsigned_short *p01;
  unsigned_short *ex;
  unsigned_short *px;
  unsigned_short i11;
  unsigned_short i10;
  unsigned_short i01;
  unsigned_short i00;
  int ox2;
  int ox1;
  int oy2;
  int oy1;
  unsigned_short *ey;
  unsigned_short *py;
  int p2;
  int p;
  int n;
  bool w14;
  uint local_9c;
  unsigned_short *local_88;
  unsigned_short *local_58;
  unsigned_short local_50;
  unsigned_short local_4e;
  unsigned_short local_4c;
  unsigned_short local_4a;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  unsigned_short *local_38;
  unsigned_short *local_30;
  uint local_28;
  uint local_24;
  uint local_20;
  byte local_1b;
  int local_18;
  uint local_14;
  int local_10;
  uint local_c;
  unsigned_short *local_8;
  
  local_1b = in_R9W < 0x4000;
  local_9c = in_ESI;
  if ((int)in_ECX < (int)in_ESI) {
    local_9c = in_ECX;
  }
  local_20 = local_9c;
  for (local_24 = 1; (int)local_24 <= (int)local_9c; local_24 = local_24 << 1) {
  }
  local_28 = (int)local_24 >> 1;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_24 = (int)local_24 >> 2; 0 < (int)local_24; local_24 = (int)local_24 >> 1) {
    local_38 = local_8 + (int)(local_18 * (local_14 - local_28));
    local_3c = local_18 * local_24;
    local_40 = local_18 * local_28;
    local_44 = local_10 * local_24;
    local_48 = local_10 * local_28;
    for (local_30 = local_8; local_30 <= local_38; local_30 = local_30 + local_40) {
      puVar1 = local_30 + (int)(local_10 * (local_c - local_28));
      for (local_58 = local_30; local_58 <= puVar1; local_58 = local_58 + local_48) {
        puVar2 = local_58 + local_44;
        a = local_58 + local_3c;
        b = a + local_44;
        if ((local_1b & 1) == 0) {
          anon_unknown_0::wdec16(*local_58,*a,&local_4a,&local_4e);
          anon_unknown_0::wdec16(*puVar2,*b,&local_4c,&local_50);
          anon_unknown_0::wdec16(local_4a,local_4c,local_58,puVar2);
          anon_unknown_0::wdec16(local_4e,local_50,a,b);
        }
        else {
          anon_unknown_0::wdec14(*local_58,*a,&local_4a,&local_4e);
          anon_unknown_0::wdec14(*puVar2,*b,&local_4c,&local_50);
          anon_unknown_0::wdec14(local_4a,local_4c,local_58,puVar2);
          anon_unknown_0::wdec14(local_4e,local_50,a,b);
        }
      }
      if ((local_c & local_24) != 0) {
        puVar1 = local_58 + local_3c;
        if ((local_1b & 1) == 0) {
          anon_unknown_0::wdec16(*local_58,*puVar1,&local_4a,puVar1);
        }
        else {
          anon_unknown_0::wdec14(*local_58,*puVar1,&local_4a,puVar1);
        }
        *local_58 = local_4a;
      }
    }
    if ((local_14 & local_24) != 0) {
      puVar1 = local_30 + (int)(local_10 * (local_c - local_28));
      for (local_88 = local_30; local_88 <= puVar1; local_88 = local_88 + local_48) {
        puVar2 = local_88 + local_44;
        if ((local_1b & 1) == 0) {
          anon_unknown_0::wdec16(*local_88,*puVar2,&local_4a,puVar2);
        }
        else {
          anon_unknown_0::wdec14(*local_88,*puVar2,&local_4a,puVar2);
        }
        *local_88 = local_4a;
      }
    }
    local_28 = local_24;
  }
  return;
}

Assistant:

void
wav2Decode
    (unsigned short*	in,	// io: values are transformed in place
     int		nx,	// i : x size
     int		ox,	// i : x offset
     int		ny,	// i : y size
     int		oy,	// i : y offset
     unsigned short	mx)	// i : maximum in[x][y] value
{
    bool w14 = (mx < (1 << 14));
    int	n = (nx > ny)? ny: nx;
    int	p = 1;
    int p2;

    //
    // Search max level
    //

    while (p <= n)
	p <<= 1;

    p >>= 1;
    p2 = p;
    p >>= 1;

    //
    // Hierarchical loop on smaller dimension n
    //

    while (p >= 1)
    {
	unsigned short *py = in;
	unsigned short *ey = in + oy * (ny - p2);
	int oy1 = oy * p;
	int oy2 = oy * p2;
	int ox1 = ox * p;
	int ox2 = ox * p2;
	unsigned short i00,i01,i10,i11;

	//
	// Y loop
	//

	for (; py <= ey; py += oy2)
	{
	    unsigned short *px = py;
	    unsigned short *ex = py + ox * (nx - p2);

	    //
	    // X loop
	    //

	    for (; px <= ex; px += ox2)
	    {
		unsigned short *p01 = px  + ox1;
		unsigned short *p10 = px  + oy1;
		unsigned short *p11 = p10 + ox1;

		//
		// 2D wavelet decoding
		//

		if (w14)
		{
		    wdec14 (*px,  *p10, i00, i10);
		    wdec14 (*p01, *p11, i01, i11);
		    wdec14 (i00, i01, *px,  *p01);
		    wdec14 (i10, i11, *p10, *p11);
		}
		else
		{
		    wdec16 (*px,  *p10, i00, i10);
		    wdec16 (*p01, *p11, i01, i11);
		    wdec16 (i00, i01, *px,  *p01);
		    wdec16 (i10, i11, *p10, *p11);
		}
	    }

	    //
	    // Decode (1D) odd column (still in Y loop)
	    //

	    if (nx & p)
	    {
		unsigned short *p10 = px + oy1;

		if (w14)
		    wdec14 (*px, *p10, i00, *p10);
		else
		    wdec16 (*px, *p10, i00, *p10);

		*px= i00;
	    }
	}

	//
	// Decode (1D) odd line (must loop in X)
	//

	if (ny & p)
	{
	    unsigned short *px = py;
	    unsigned short *ex = py + ox * (nx - p2);

	    for (; px <= ex; px += ox2)
	    {
		unsigned short *p01 = px + ox1;

		if (w14)
		    wdec14 (*px, *p01, i00, *p01);
		else
		    wdec16 (*px, *p01, i00, *p01);

		*px= i00;
	    }
	}

	//
	// Next level
	//

	p2 = p;
	p >>= 1;
    }
}